

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCone.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChRoundedCone::ChRoundedCone(ChRoundedCone *this,ChRoundedCone *source)

{
  (this->super_ChGeometry)._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_0118b5b8;
  (this->center).m_data[0] = 0.0;
  (this->center).m_data[1] = 0.0;
  (this->center).m_data[2] = 0.0;
  (this->rad).m_data[0] = 0.0;
  (this->center).m_data[2] = 0.0;
  (this->rad).m_data[0] = 0.0;
  (this->rad).m_data[1] = 0.0;
  (this->rad).m_data[2] = 0.0;
  if (source != this) {
    (this->center).m_data[0] = (source->center).m_data[0];
    (this->center).m_data[1] = (source->center).m_data[1];
    (this->center).m_data[2] = (source->center).m_data[2];
    (this->rad).m_data[0] = (source->rad).m_data[0];
    (this->rad).m_data[1] = (source->rad).m_data[1];
    (this->rad).m_data[2] = (source->rad).m_data[2];
  }
  this->radsphere = source->radsphere;
  return;
}

Assistant:

ChRoundedCone::ChRoundedCone(const ChRoundedCone& source) {
    center = source.center;
    rad = source.rad;
    radsphere = source.radsphere;
}